

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::GradientShader::shadeFragments(GradientShader *this)

{
  FragmentShadingContext *in_RCX;
  int in_EDX;
  FragmentPacket *in_RSI;
  
  shadeFragments((GradientShader *)
                 &this[-1].super_ShaderProgram.m_attributeNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void GradientShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4	gradientMin(m_uniforms[0].value.f4);
	const tcu::Vec4	gradientMax(m_uniforms[1].value.f4);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec4		coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
		const float			x		= coord.x();
		const float			y		= coord.y();
		const float			f0		= (x + y) * 0.5f;
		const float			f1		= 0.5f + (x - y) * 0.5f;
		const tcu::Vec4		fv		= Vec4(f0, f1, 1.0f-f0, 1.0f-f1);

		const tcu::Vec4		color	= gradientMin + (gradientMax-gradientMin) * fv;
		const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
		const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

		if (m_outputType == glu::TYPE_FLOAT_VEC4)			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
		else if (m_outputType == glu::TYPE_INT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
		else if (m_outputType == glu::TYPE_UINT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
		else
			DE_ASSERT(DE_FALSE);
	}
}